

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashing.cpp
# Opt level: O2

bool isValidChash160(char *chash)

{
  uchar i_1;
  byte bVar1;
  uchar uVar2;
  uchar uVar3;
  size_t sVar4;
  void *pvVar5;
  ostream *poVar6;
  ulong uVar7;
  long lVar8;
  bool *pbVar9;
  ulong uVar10;
  int iVar11;
  uchar i;
  long lVar12;
  bool bVar13;
  bool abStack_257 [187];
  uint8_t calculatedChecksum [4];
  uint8_t hash160 [20];
  bool checksumBin [32];
  bool hash160Bin [128];
  bool checksumedHashBin [160];
  
  sVar4 = strlen(chash);
  if (sVar4 == 0x20) {
    iVar11 = 4;
    for (lVar12 = 0; lVar12 != 0x20; lVar12 = lVar12 + 1) {
      pvVar5 = memchr("ABCDEFGHIJKLMNOPQRSTUVWXYZ234567",(int)chash[lVar12],0x21);
      bVar1 = (char)pvVar5 + 0x90;
      for (lVar8 = 0; lVar8 != -5; lVar8 = lVar8 + -1) {
        checksumedHashBin[(uint)(iVar11 + (int)lVar8)] = (bool)(bVar1 & 1);
        bVar1 = bVar1 >> 1;
      }
      iVar11 = iVar11 + 5;
    }
    bVar1 = 0;
    for (uVar7 = 0; uVar7 != 0xa0; uVar7 = uVar7 + 1) {
      uVar10 = (ulong)bVar1;
      if (uVar7 == offsets[uVar10]) {
        checksumBin[uVar10] = checksumedHashBin[uVar7];
        bVar1 = bVar1 + 1;
      }
      else {
        hash160Bin[uVar7 - uVar10] = checksumedHashBin[uVar7];
      }
    }
    pbVar9 = hash160Bin;
    for (lVar12 = 4; lVar12 != 0x14; lVar12 = lVar12 + 1) {
      uVar2 = binArrayToByte(pbVar9);
      hash160[lVar12] = uVar2;
      pbVar9 = pbVar9 + 8;
    }
    getChecksum((char *)hash160,calculatedChecksum);
    pbVar9 = checksumBin;
    uVar7 = 0;
    do {
      uVar10 = uVar7;
      if (uVar10 == 4) break;
      uVar2 = calculatedChecksum[uVar10];
      uVar3 = binArrayToByte(pbVar9);
      pbVar9 = pbVar9 + 8;
      uVar7 = uVar10 + 1;
    } while (uVar2 == uVar3);
    bVar13 = 3 < uVar10;
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::clog,"chash is not 32 length");
    std::endl<char,std::char_traits<char>>(poVar6);
    bVar13 = false;
  }
  return bVar13;
}

Assistant:

bool isValidChash160(const char *chash) {

    if (strlen(chash) != 32) {
#ifdef DEBUG_PRINT
        std::clog << "chash is not 32 length" << std::endl;
#endif
        return false;
    }

    bool checksumBin[32];
    bool checksumedHashBin[160];
    bool hash160Bin[128];

    //convert base32 to bin
    char *pch;
    unsigned char value = 0;
    for (unsigned char i = 0; i < 32; i++) {
        pch = (char *) strchr(base32Chars, chash[i]);
        value = pch - base32Chars;
        for (unsigned char j = 5; j > 0; j--) {
            checksumedHashBin[i * 5 + j - 1] = value & 1;
            value /= 2;
        }
    }

    //unmix data
    unsigned char indexOffset = 0;
    for (unsigned char i = 0; i < 160; i++) {
        if (i == offsets[indexOffset]) {
            checksumBin[indexOffset] = checksumedHashBin[i];
            indexOffset++;

        } else {
            hash160Bin[i - indexOffset] = checksumedHashBin[i];
        }
    }

    uint8_t hash160[20];
    //convert bin to byte
    for (int i = 0; i < 16; i++) {
        hash160[i + 4] = binArrayToByte(&hash160Bin[i * 8]);
    }

    uint8_t calculatedChecksum[4];
    getChecksum((char *) hash160, calculatedChecksum);

    //compare checksums
    for (int i = 0; i < 4; i++) {
        if (calculatedChecksum[i] != binArrayToByte(&checksumBin[i * 8]))
            return false;
    }
    return true;
}